

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

void __thiscall
poplar::
map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_8UL>_>
::map(map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_8UL>_>
      *this,uint32_t capa_bits,uint64_t lambda)

{
  undefined1 auVar1 [48];
  pointer puVar2;
  pointer puVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined8 *puVar7;
  uint32_t uVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 local_88 [64];
  size_p2 sStack_48;
  size_p2 sStack_38;
  
  auVar9 = ZEXT1664((undefined1  [16])0x0);
  this->is_ready_ = false;
  this->lambda_ = 0x20;
  (this->hash_trie_).capa_size_.mask_ = 0;
  (this->hash_trie_).symb_size_.bits_ = 0;
  (this->hash_trie_).capa_size_.bits_ = 0;
  auVar10 = vmovdqu64_avx512f(auVar9);
  auVar1 = auVar10._0_48_;
  (this->hash_trie_).table_.chunks_ =
       (vector<unsigned_long,_std::allocator<unsigned_long>_>)auVar1._0_24_;
  (this->hash_trie_).table_.size_ = auVar1._24_8_;
  (this->hash_trie_).table_.mask_ = auVar1._32_8_;
  (this->hash_trie_).table_.width_ = auVar1._40_8_;
  (this->hash_trie_).size_ = auVar10._48_8_;
  (this->hash_trie_).max_size_ = auVar10._56_8_;
  this->size_ = 0;
  auVar10 = vmovdqu64_avx512f(auVar9);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0xb8) = auVar10;
  auVar10 = vmovdqu64_avx512f(auVar9);
  *(undefined1 (*) [64])&(this->hash_trie_).symb_size_.mask_ = auVar10;
  auVar10 = vmovdqu64_avx512f(auVar9);
  *(undefined1 (*) [64])&(this->label_store_).label_bytes_ = auVar10;
  auVar10 = vmovdqu64_avx512f(auVar9);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0x38) = auVar10;
  auVar10 = vmovdqu64_avx512f(auVar9);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0x78) = auVar10;
  auVar10 = vmovdqu64_avx512f(auVar9);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0xc4) = auVar10;
  if ((int)POPCOUNT(lambda) == 1) {
    this->is_ready_ = true;
    this->lambda_ = lambda;
    uVar8 = 8;
    if (1 < lambda) {
      uVar8 = 0x48 - (int)LZCOUNT(lambda - 1);
    }
    plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::plain_bonsai_trie
              ((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)local_88,capa_bits,uVar8);
    puVar2 = (this->hash_trie_).table_.chunks_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->hash_trie_).table_.chunks_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->hash_trie_).table_.chunks_.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
    (this->hash_trie_).table_.chunks_.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_88._8_8_;
    local_88._0_16_ = ZEXT816(0) << 0x20;
    (this->hash_trie_).table_.chunks_.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_88._16_8_;
    local_88._16_8_ = (pointer)0x0;
    if (puVar2 == (pointer)0x0) {
      (this->hash_trie_).table_.width_ = local_88._40_8_;
      (this->hash_trie_).table_.size_ = local_88._24_8_;
      (this->hash_trie_).table_.mask_ = local_88._32_8_;
      auVar6._16_8_ = sStack_48._0_8_;
      auVar6._0_16_ = local_88._48_16_;
      auVar6._24_8_ = sStack_48.mask_;
      auVar5 = auVar6._16_16_;
      (this->hash_trie_).size_ = local_88._48_8_;
      (this->hash_trie_).max_size_ = local_88._56_8_;
      (this->hash_trie_).capa_size_.bits_ = auVar5._0_4_;
      *(int *)&(this->hash_trie_).capa_size_.field_0x4 = auVar5._4_4_;
      (this->hash_trie_).capa_size_.mask_ = auVar5._8_8_;
      (this->hash_trie_).capa_size_.bits_ = sStack_48.bits_;
      *(undefined4 *)&(this->hash_trie_).capa_size_.field_0x4 = sStack_48._4_4_;
      (this->hash_trie_).capa_size_.mask_ = sStack_48.mask_;
      (this->hash_trie_).symb_size_.bits_ = sStack_38.bits_;
      *(undefined4 *)&(this->hash_trie_).symb_size_.field_0x4 = sStack_38._4_4_;
      (this->hash_trie_).symb_size_.mask_ = sStack_38.mask_;
    }
    else {
      operator_delete(puVar2,(long)puVar3 - (long)puVar2);
      (this->hash_trie_).table_.width_ = local_88._40_8_;
      (this->hash_trie_).table_.size_ = local_88._24_8_;
      (this->hash_trie_).table_.mask_ = local_88._32_8_;
      auVar4._16_8_ = sStack_48._0_8_;
      auVar4._0_16_ = local_88._48_16_;
      auVar4._24_8_ = sStack_48.mask_;
      auVar5 = auVar4._16_16_;
      (this->hash_trie_).size_ = local_88._48_8_;
      (this->hash_trie_).max_size_ = local_88._56_8_;
      (this->hash_trie_).capa_size_.bits_ = auVar5._0_4_;
      *(int *)&(this->hash_trie_).capa_size_.field_0x4 = auVar5._4_4_;
      (this->hash_trie_).capa_size_.mask_ = auVar5._8_8_;
      (this->hash_trie_).capa_size_.bits_ = sStack_48.bits_;
      *(undefined4 *)&(this->hash_trie_).capa_size_.field_0x4 = sStack_48._4_4_;
      (this->hash_trie_).capa_size_.mask_ = sStack_48.mask_;
      (this->hash_trie_).symb_size_.bits_ = sStack_38.bits_;
      *(undefined4 *)&(this->hash_trie_).symb_size_.field_0x4 = sStack_38._4_4_;
      (this->hash_trie_).symb_size_.mask_ = sStack_38.mask_;
      if ((pointer)local_88._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
      }
    }
    auVar10 = ZEXT1664(local_88._48_16_);
    compact_bonsai_nlm<int,_8UL>::compact_bonsai_nlm
              ((compact_bonsai_nlm<int,_8UL> *)local_88,(this->hash_trie_).capa_size_.bits_);
    compact_bonsai_nlm<int,_8UL>::operator=
              (&this->label_store_,(compact_bonsai_nlm<int,_8UL> *)local_88);
    compact_bonsai_nlm<int,_8UL>::~compact_bonsai_nlm((compact_bonsai_nlm<int,_8UL> *)local_88);
    auVar9 = vpternlogd_avx512f(auVar10,auVar10,auVar10,0xff);
    auVar10 = vmovdqu64_avx512f(auVar9);
    *(undefined1 (*) [64])(this->codes_)._M_elems = auVar10;
    auVar10 = vmovdqu64_avx512f(auVar9);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0xc0) = auVar10;
    auVar10 = vmovdqu64_avx512f(auVar9);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0x80) = auVar10;
    auVar10 = vmovdqu64_avx512f(auVar9);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0x40) = auVar10;
    uVar8 = this->num_codes_;
    this->num_codes_ = uVar8 + 1;
    (this->codes_)._M_elems[0] = (uchar)uVar8;
    return;
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar7 = &PTR__exception_00183a50;
  puVar7[1] = 
  "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:57:lambda must be a power of 2."
  ;
  __cxa_throw(puVar7,&exception::typeinfo,std::exception::~exception);
}

Assistant:

explicit map(uint32_t capa_bits, uint64_t lambda = 32) {
        POPLAR_THROW_IF(!is_power2(lambda), "lambda must be a power of 2.");

        is_ready_ = true;
        lambda_ = lambda;
        hash_trie_ = Trie{capa_bits, 8 + bit_tools::ceil_log2(lambda_)};
        label_store_ = NLM{hash_trie_.capa_bits()};
        codes_.fill(UINT8_MAX);
        codes_[0] = static_cast<uint8_t>(num_codes_++);  // terminator
    }